

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

void __thiscall snestistics::LargeBitfield::read_file(LargeBitfield *this,FILE *f)

{
  uint uVar1;
  uint32_t *__ptr;
  ulong __n;
  uint32_t new_size;
  uint local_1c;
  
  local_1c = 0;
  fread(&local_1c,4,1,(FILE *)f);
  uVar1 = local_1c;
  __n = (ulong)local_1c;
  __ptr = this->_state;
  if (local_1c != this->_num_elements) {
    if (__ptr != (uint32_t *)0x0) {
      operator_delete__(__ptr);
    }
    __ptr = (uint32_t *)operator_new__(__n * 4);
    this->_state = __ptr;
    this->_num_elements = uVar1;
  }
  fread(__ptr,4,__n,(FILE *)f);
  return;
}

Assistant:

void LargeBitfield::read_file(FILE * f) {
	uint32_t new_size = 0;
	fread(&new_size, sizeof(uint32_t), 1, f);

	if (new_size != _num_elements) {
		delete[] _state;
		_state = new uint32_t[new_size];
		_num_elements = new_size;
	}

	fread(_state, sizeof(uint32_t), new_size, f);
}